

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

bool Guest_ContactHost(void *userdata)

{
  int iVar1;
  sockaddr_in *address;
  char *error;
  PreGamePacket packet;
  undefined2 local_64;
  byte local_62;
  byte local_61;
  
  local_64 = 0x30;
  sendto(mysocket,&local_64,2,0,(sockaddr *)(sendaddress + 1),0x10);
  address = PreGet(&local_64,0x44,true);
  if (address != (sockaddr_in *)0x0) {
    do {
      if (((char)local_64 == '0') && (iVar1 = FindNode(address), iVar1 == 1)) {
        error = "The host cancelled the game.";
        if (local_64._1_1_ != '\x02') {
          if (local_64._1_1_ != '\x05') {
            if (local_64._1_1_ == '\x04') {
              (*StartScreen->_vptr_FStartupScreen[7])
                        (StartScreen,"Total players: %d",(ulong)local_62);
              (*StartScreen->_vptr_FStartupScreen[5])
                        (StartScreen,"Waiting for other players",(ulong)local_62);
              (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)local_61);
              return true;
            }
            goto LAB_004ed148;
          }
          error = "The game is full.";
        }
        doomcom.numnodes = 0;
        I_FatalError(error);
      }
LAB_004ed148:
      address = PreGet(&local_64,0x44,true);
    } while (address != (sockaddr_in *)0x0);
  }
  (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,0);
  return false;
}

Assistant:

bool Guest_ContactHost (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	// Let the host know we are here.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONNECT;
	PreSend (&packet, 2, &sendaddress[1]);

	// Listen for a reply.
	while ( (from = PreGet (&packet, sizeof(packet), true)) )
	{
		if (packet.Fake == PRE_FAKE && FindNode(from) == 1)
		{
			if (packet.Message == PRE_CONACK)
			{
				StartScreen->NetMessage ("Total players: %d", packet.NumNodes);
				StartScreen->NetInit ("Waiting for other players", packet.NumNodes);
				StartScreen->NetProgress (packet.NumPresent);
				return true;
			}
			else if (packet.Message == PRE_DISCONNECT)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The host cancelled the game.");
			}
			else if (packet.Message == PRE_ALLFULL)
			{
				doomcom.numnodes = 0;
				I_FatalError ("The game is full.");
			}
		}
	}

	// In case the progress bar could not be marqueed, bump it.
	StartScreen->NetProgress (0);

	return false;
}